

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::fpToString<double>(double value,int precision)

{
  ostream *this;
  char *in;
  long lVar1;
  long lVar2;
  char *pcVar3;
  int in_ESI;
  String *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  string d;
  ostringstream oss;
  String *this_00;
  string local_1f0 [32];
  long local_1d0;
  string local_1c8 [52];
  int local_194;
  ostringstream local_190 [380];
  int local_14;
  double local_10;
  
  this_00 = in_RDI;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(local_14);
  this = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  in = (char *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(in,local_10);
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)local_1c8,0x30);
  local_1d0 = lVar1;
  if (lVar1 != -1) {
    lVar2 = std::__cxx11::string::size();
    if (lVar1 != lVar2 + -1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1c8);
      if (*pcVar3 == '.') {
        local_1d0 = local_1d0 + 1;
      }
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)local_1c8);
      std::__cxx11::string::operator=(local_1c8,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
  }
  std::__cxx11::string::c_str();
  String::String(this_00,in);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }